

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

QString * __thiscall
QAccessibleTextWidget::textAtOffset
          (QAccessibleTextWidget *this,int offset,TextBoundaryType boundaryType,int *startOffset,
          int *endOffset)

{
  ulong uVar1;
  TextBoundaryType in_ECX;
  MoveMode in_EDX;
  long *in_RSI;
  QString *in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  long in_FS_OFFSET;
  pair<int,_int> boundaries;
  QTextCursor cursor;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*in_RSI + 0x158))();
  QTextCursor::setPosition((int)(QTextCursor *)&local_10,in_EDX);
  uVar1 = QAccessible::qAccessibleTextBoundaryHelper((QTextCursor *)&local_10,in_ECX);
  local_18 = (undefined4)uVar1;
  *in_R8 = local_18;
  uStack_14 = (undefined4)(uVar1 >> 0x20);
  *in_R9 = uStack_14;
  (**(code **)(*in_RSI + 0xf8))(in_RDI,in_RSI,uVar1 & 0xffffffff,uStack_14);
  QTextCursor::~QTextCursor((QTextCursor *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTextWidget::textAtOffset(int offset, QAccessible::TextBoundaryType boundaryType,
                                            int *startOffset, int *endOffset) const
{
    Q_ASSERT(startOffset);
    Q_ASSERT(endOffset);

    QTextCursor cursor = textCursor();
    cursor.setPosition(offset);
    std::pair<int, int> boundaries = QAccessible::qAccessibleTextBoundaryHelper(cursor, boundaryType);

    *startOffset = boundaries.first;
    *endOffset = boundaries.second;

    return text(boundaries.first, boundaries.second);
}